

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bacPrs.h
# Opt level: O0

Psr_Man_t * Psr_ManAlloc(char *pFileName)

{
  Abc_Nam_t *pAVar1;
  Vec_Ptr_t *pVVar2;
  char *local_30;
  char *pLimit;
  char *pBuffer;
  Psr_Man_t *p;
  char *pFileName_local;
  
  p = (Psr_Man_t *)pFileName;
  pLimit = Psr_ManLoadFile(pFileName,&local_30);
  if (pLimit == (char *)0x0) {
    pFileName_local = (char *)0x0;
  }
  else {
    pBuffer = (char *)calloc(1,0x488);
    *(Psr_Man_t **)pBuffer = p;
    *(char **)(pBuffer + 8) = pLimit;
    *(char **)(pBuffer + 0x10) = local_30;
    *(char **)(pBuffer + 0x18) = pLimit;
    pAVar1 = Abc_NamStart(1000,0x18);
    *(Abc_Nam_t **)(pBuffer + 0x20) = pAVar1;
    pVVar2 = Vec_PtrAlloc(100);
    *(Vec_Ptr_t **)(pBuffer + 0x30) = pVVar2;
    pFileName_local = pBuffer;
  }
  return (Psr_Man_t *)pFileName_local;
}

Assistant:

static inline Psr_Man_t * Psr_ManAlloc( char * pFileName )
{
    Psr_Man_t * p;
    char * pBuffer, * pLimit;
    pBuffer = Psr_ManLoadFile( pFileName, &pLimit );
    if ( pBuffer == NULL )
        return NULL;
    p = ABC_CALLOC( Psr_Man_t, 1 );
    p->pName   = pFileName;
    p->pBuffer = pBuffer;
    p->pLimit  = pLimit;
    p->pCur    = pBuffer;
    p->pStrs   = Abc_NamStart( 1000, 24 );
    p->vNtks   = Vec_PtrAlloc( 100 );
    return p;
}